

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O3

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  bool bVar1;
  size_t sVar2;
  ChunkHeader *pCVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (size == 0) {
    return (void *)0x0;
  }
  pCVar3 = this->chunkHead_;
  uVar4 = size + 7 & 0xfffffffffffffff8;
  if (pCVar3 != (ChunkHeader *)0x0) {
    sVar2 = pCVar3->size;
    uVar5 = sVar2 + uVar4;
    if (uVar5 <= pCVar3->capacity) goto LAB_00103126;
  }
  uVar5 = this->chunk_capacity_;
  if (this->chunk_capacity_ <= uVar4) {
    uVar5 = uVar4;
  }
  bVar1 = AddChunk(this,uVar5);
  if (!bVar1) {
    return (void *)0x0;
  }
  pCVar3 = this->chunkHead_;
  sVar2 = pCVar3->size;
  uVar5 = uVar4 + sVar2;
LAB_00103126:
  pCVar3->size = uVar5;
  return (void *)((long)&pCVar3[1].capacity + sVar2);
}

Assistant:

void* Malloc(size_t size) {
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (chunkHead_ == 0 || chunkHead_->size + size > chunkHead_->capacity)
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = reinterpret_cast<char *>(chunkHead_) + RAPIDJSON_ALIGN(sizeof(ChunkHeader)) + chunkHead_->size;
        chunkHead_->size += size;
        return buffer;
    }